

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O0

optional<cmList> *
anon_unknown.dwarf_fe4d0d::GetList
          (optional<cmList> *__return_storage_ptr__,string *var,cmMakefile *makefile)

{
  bool bVar1;
  PolicyStatus PVar2;
  ulong uVar3;
  cmList *pcVar4;
  PolicyID id;
  PolicyID id_00;
  string local_f8;
  string local_d8;
  undefined1 local_b8 [8];
  string warn;
  EmptyElements local_74 [5];
  undefined1 local_60 [8];
  string listString;
  optional<cmList> list;
  cmMakefile *makefile_local;
  string *var_local;
  
  std::optional<cmList>::optional((optional<cmList> *)((long)&listString.field_2 + 8));
  std::__cxx11::string::string((string *)local_60);
  bVar1 = GetListString((string *)local_60,var,makefile);
  if (bVar1) {
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      local_74[0] = Yes;
      std::optional<cmList>::emplace<std::__cxx11::string&,cmList::EmptyElements>
                ((optional<cmList> *)((long)&listString.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                 local_74);
      pcVar4 = std::optional<cmList>::operator*((optional<cmList> *)((long)&listString.field_2 + 8))
      ;
      std::__cxx11::string::string((string *)(warn.field_2._M_local_buf + 8));
      bVar1 = ::cm::
              contains<cmList,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        (pcVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(warn.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(warn.field_2._M_local_buf + 8));
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        PVar2 = cmMakefile::GetPolicyStatus(makefile,CMP0007,false);
        switch(PVar2) {
        case OLD:
          pcVar4 = std::optional<cmList>::operator->
                             ((optional<cmList> *)((long)&listString.field_2 + 8));
          cmList::assign(pcVar4,(string *)local_60,Yes,No);
          std::optional<cmList>::optional
                    (__return_storage_ptr__,(optional<cmList> *)((long)&listString.field_2 + 8));
          local_74[1] = 1;
          break;
        case WARN:
          pcVar4 = std::optional<cmList>::operator->
                             ((optional<cmList> *)((long)&listString.field_2 + 8));
          cmList::assign(pcVar4,(string *)local_60,Yes,No);
          cmPolicies::GetPolicyWarning_abi_cxx11_(&local_d8,(cmPolicies *)0x7,id_00);
          cmStrCat<std::__cxx11::string,char_const(&)[20],std::__cxx11::string&,char_const(&)[3]>
                    ((string *)local_b8,&local_d8,(char (*) [20])" List has value = [",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                     (char (*) [3])0x124d3ec);
          std::__cxx11::string::~string((string *)&local_d8);
          cmMakefile::IssueMessage(makefile,AUTHOR_WARNING,(string *)local_b8);
          std::optional<cmList>::optional
                    (__return_storage_ptr__,(optional<cmList> *)((long)&listString.field_2 + 8));
          local_74[1] = 1;
          std::__cxx11::string::~string((string *)local_b8);
          break;
        case NEW:
          std::optional<cmList>::optional
                    (__return_storage_ptr__,(optional<cmList> *)((long)&listString.field_2 + 8));
          local_74[1] = 1;
          break;
        case REQUIRED_IF_USED:
        case REQUIRED_ALWAYS:
          cmPolicies::GetRequiredPolicyError_abi_cxx11_(&local_f8,(cmPolicies *)0x7,id);
          cmMakefile::IssueMessage(makefile,FATAL_ERROR,&local_f8);
          std::__cxx11::string::~string((string *)&local_f8);
          std::optional<cmList>::optional(__return_storage_ptr__);
          local_74[1] = 1;
          break;
        default:
          std::optional<cmList>::optional
                    (__return_storage_ptr__,(optional<cmList> *)((long)&listString.field_2 + 8));
          local_74[1] = 1;
        }
      }
      else {
        std::optional<cmList>::optional
                  (__return_storage_ptr__,(optional<cmList> *)((long)&listString.field_2 + 8));
        local_74[1] = 1;
      }
    }
    else {
      std::optional<cmList>::emplace<>((optional<cmList> *)((long)&listString.field_2 + 8));
      std::optional<cmList>::optional
                (__return_storage_ptr__,(optional<cmList> *)((long)&listString.field_2 + 8));
      local_74[1] = 1;
    }
  }
  else {
    std::optional<cmList>::optional
              (__return_storage_ptr__,(optional<cmList> *)((long)&listString.field_2 + 8));
    local_74[1] = 1;
  }
  std::__cxx11::string::~string((string *)local_60);
  std::optional<cmList>::~optional((optional<cmList> *)((long)&listString.field_2 + 8));
  return __return_storage_ptr__;
}

Assistant:

cm::optional<cmList> GetList(const std::string& var,
                             const cmMakefile& makefile)
{
  cm::optional<cmList> list;

  std::string listString;
  if (!GetListString(listString, var, makefile)) {
    return list;
  }
  // if the size of the list
  if (listString.empty()) {
    list.emplace();
    return list;
  }
  // expand the variable into a list
  list.emplace(listString, cmList::EmptyElements::Yes);
  // if no empty elements then just return
  if (!cm::contains(*list, std::string())) {
    return list;
  }
  // if we have empty elements we need to check policy CMP0007
  switch (makefile.GetPolicyStatus(cmPolicies::CMP0007)) {
    case cmPolicies::WARN: {
      // Default is to warn and use old behavior
      // OLD behavior is to allow compatibility, so recall
      // ExpandListArgument without the true which will remove
      // empty values
      list->assign(listString);
      std::string warn =
        cmStrCat(cmPolicies::GetPolicyWarning(cmPolicies::CMP0007),
                 " List has value = [", listString, "].");
      makefile.IssueMessage(MessageType::AUTHOR_WARNING, warn);
      return list;
    }
    case cmPolicies::OLD:
      // OLD behavior is to allow compatibility, so recall
      // ExpandListArgument without the true which will remove
      // empty values
      list->assign(listString);
      return list;
    case cmPolicies::NEW:
      return list;
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS:
      makefile.IssueMessage(
        MessageType::FATAL_ERROR,
        cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0007));
      return {};
  }
  return list;
}